

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O2

HighsStatus __thiscall
HighsIis::compute(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  _Alloc_hider _Var5;
  ulong uVar6;
  HighsStatus HVar7;
  HighsLp *pHVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  uint bound_status;
  vector<int,_std::allocator<int>_> *pvVar10;
  long lVar11;
  ulong uVar12;
  size_type __new_size;
  HighsInt iCol;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  HighsIis *this_01;
  size_type __new_size_00;
  bool row_deletion;
  HighsStatus run_status;
  uint local_56bc;
  double local_56b8;
  double local_56b0;
  uint local_56a8;
  bool drop_lower;
  vector<int,_std::allocator<int>_> *local_56a0;
  HighsOptions *local_5698;
  HighsInt local_568c;
  HighsInt check_num_nz;
  HighsInt check_num_ix;
  HighsLogOptions *local_5680;
  string type;
  double check_upper;
  double check_lower;
  anon_class_96_12_a4261637 solveLp;
  vector<double,_std::allocator<double>_> cost;
  vector<double,_std::allocator<double>_> primal_phase1_dual;
  double check_cost;
  HighsLp local_5588;
  Highs highs;
  
  local_568c = (options->super_HighsOptionsStruct).iis_strategy;
  local_5698 = options;
  for (iVar13 = 0; iVar13 < lp->num_col_; iVar13 = iVar13 + 1) {
    addCol(this,iVar13,0);
  }
  local_5680 = &(local_5698->super_HighsOptionsStruct).log_options;
  for (iVar13 = 0; iVar13 < lp->num_row_; iVar13 = iVar13 + 1) {
    addRow(this,iVar13,0);
  }
  Highs::Highs(&highs);
  std::__cxx11::string::string((string *)&solveLp,"output_flag",(allocator *)&type);
  Highs::setOptionValue(&highs,(string *)&solveLp,false);
  std::__cxx11::string::~string((string *)&solveLp);
  std::__cxx11::string::string((string *)&solveLp,"presolve",(allocator *)&type);
  Highs::setOptionValue(&highs,(string *)&solveLp,&::kHighsOffString_abi_cxx11_);
  std::__cxx11::string::~string((string *)&solveLp);
  HighsLp::HighsLp(&local_5588,lp);
  HVar7 = Highs::passModel(&highs,&local_5588);
  HighsLp::~HighsLp(&local_5588);
  run_status = HVar7;
  if (basis != (HighsBasis *)0x0) {
    std::__cxx11::string::string((string *)&solveLp,"",(allocator *)&type);
    Highs::setBasis(&highs,basis,(string *)&solveLp);
    std::__cxx11::string::~string((string *)&solveLp);
  }
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  solveLp.highs = (Highs *)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&cost,(long)lp->num_col_,(value_type_conflict1 *)&solveLp);
  run_status = Highs::changeColsCost
                         (&highs,0,lp->num_col_ + -1,
                          cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  if (basis != (HighsBasis *)0x0) {
    std::__cxx11::string::string((string *)&solveLp,"",(allocator *)&type);
    Highs::setBasis(&highs,basis,(string *)&solveLp);
    std::__cxx11::string::~string((string *)&solveLp);
  }
  solveLp.info = &highs.info_;
  solveLp.incumbent_basis = &highs.basis_;
  solveLp.solution = &highs.solution_;
  solveLp.primal_phase1_dual = &primal_phase1_dual;
  primal_phase1_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  primal_phase1_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  primal_phase1_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  solveLp.row_deletion = &row_deletion;
  row_deletion = false;
  solveLp.iX = (HighsInt *)&local_56bc;
  local_56bc = 0xffffffff;
  solveLp.drop_lower = &drop_lower;
  drop_lower = false;
  solveLp.run_status = &run_status;
  solveLp.options = local_5698;
  solveLp.highs = &highs;
  solveLp.lp = lp;
  solveLp.this = this;
  HVar7 = compute::anon_class_96_12_a4261637::operator()(&solveLp);
  run_status = HVar7;
  if (HVar7 == kOk) {
    this_00 = &this->row_bound_;
    pvVar9 = &this->col_bound_;
    uVar14 = 0;
    local_56a0 = pvVar9;
    while (uVar14 != 2) {
      row_deletion = uVar14 == 1 && local_568c != 0 || uVar14 == 0 && local_568c == 0;
      pcVar15 = "Col";
      if (uVar14 == 1 && local_568c != 0 || uVar14 == 0 && local_568c == 0) {
        pcVar15 = "Row";
      }
      local_56a8 = uVar14;
      std::__cxx11::string::string((string *)&type,pcVar15,(allocator *)&check_lower);
      pHVar8 = lp;
      if (row_deletion != false) {
        pHVar8 = (HighsLp *)&lp->num_row_;
      }
      iVar13 = pHVar8->num_col_;
      for (local_56bc = 0; (int)local_56bc < iVar13; local_56bc = local_56bc + 1) {
        pvVar10 = pvVar9;
        if (row_deletion != false) {
          pvVar10 = this_00;
        }
        iVar2 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)local_56bc];
        if ((iVar2 != -1) && (iVar2 != 1)) {
          if (row_deletion == false) {
            local_56b8 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)local_56bc];
            local_56b0 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)local_56bc];
            if (local_56b8 != -INFINITY) {
              run_status = Highs::changeColBounds(&highs,local_56bc,-INFINITY,local_56b0);
              goto LAB_0024bc1b;
            }
LAB_0024bcd6:
            if (local_56b0 != INFINITY) {
              if (row_deletion == true) {
                run_status = Highs::changeRowBounds(&highs,local_56bc,local_56b8,INFINITY);
              }
              else {
                run_status = Highs::changeColBounds(&highs,local_56bc,local_56b8,INFINITY);
              }
              HVar7 = compute::anon_class_96_12_a4261637::operator()(&solveLp);
              if (HVar7 != kOk) {
LAB_0024bfe9:
                run_status = HVar7;
                std::__cxx11::string::~string((string *)&type);
                if (local_56a8 < 2) goto LAB_0024c0b2;
                goto LAB_0024c001;
              }
              run_status = kOk;
              if (highs.model_status_ != kOptimal) goto LAB_0024bdba;
              run_status = HVar7;
              if (row_deletion == true) {
                run_status = Highs::changeRowBounds(&highs,local_56bc,local_56b8,local_56b0);
              }
              else {
                run_status = Highs::changeColBounds(&highs,local_56bc,local_56b8,local_56b0);
              }
            }
          }
          else {
            local_56b8 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)local_56bc];
            local_56b0 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)local_56bc];
            if (local_56b8 == -INFINITY) goto LAB_0024bcd6;
            run_status = Highs::changeRowBounds(&highs,local_56bc,-INFINITY,local_56b0);
LAB_0024bc1b:
            HVar7 = compute::anon_class_96_12_a4261637::operator()(&solveLp);
            if (HVar7 != kOk) goto LAB_0024bfe9;
            if (highs.model_status_ != kOptimal) {
              local_56b8 = -INFINITY;
              run_status = kOk;
              goto LAB_0024bcd6;
            }
            run_status = HVar7;
            if (row_deletion == true) {
              run_status = Highs::changeRowBounds(&highs,local_56bc,local_56b8,local_56b0);
            }
            else {
              run_status = Highs::changeColBounds(&highs,local_56bc,local_56b8,local_56b0);
            }
            if (local_56b0 == INFINITY) goto LAB_0024bcd6;
            if (row_deletion == true) {
              run_status = Highs::changeRowBounds(&highs,local_56bc,local_56b8,INFINITY);
            }
            else {
              run_status = Highs::changeColBounds(&highs,local_56bc,local_56b8,INFINITY);
            }
LAB_0024bdba:
            local_56b0 = INFINITY;
          }
          if (row_deletion == true) {
            this_01 = (HighsIis *)(ulong)local_56bc;
            run_status = Highs::getRows(&highs,local_56bc,local_56bc,&check_num_ix,&check_lower,
                                        &check_upper,&check_num_nz,(HighsInt *)0x0,(HighsInt *)0x0,
                                        (double *)0x0);
          }
          else {
            this_01 = (HighsIis *)(ulong)local_56bc;
            run_status = Highs::getCols(&highs,local_56bc,local_56bc,&check_num_ix,&check_cost,
                                        &check_lower,&check_upper,&check_num_nz,(HighsInt *)0x0,
                                        (HighsInt *)0x0,(double *)0x0);
          }
          _Var5._M_p = type._M_dataplus._M_p;
          uVar14 = local_56bc;
          if (-INFINITY < local_56b8) {
            bound_status = (uint)(local_56b0 < INFINITY) * 2 + 2;
          }
          else if (local_56b0 < INFINITY) {
            bound_status = 3;
          }
          else {
            bound_status = -(row_deletion & 1) | 1;
          }
          if ((row_deletion & 1U) != 0) {
            pvVar9 = this_00;
          }
          (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[(int)local_56bc] = bound_status;
          iisBoundStatusToString_abi_cxx11_((string *)&check_lower,this_01,bound_status);
          highsLogUser(local_5680,kInfo,"%s %d has status %s\n",_Var5._M_p,(ulong)uVar14,check_lower
                      );
          std::__cxx11::string::~string((string *)&check_lower);
          pvVar9 = local_56a0;
        }
      }
      if ((local_56a8 != 1) && (row_deletion == true)) {
        uVar6 = 0;
LAB_0024bf43:
        uVar12 = uVar6;
        if ((long)uVar12 < (long)lp->num_col_) {
          piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = (long)piVar3[uVar12];
          do {
            uVar6 = uVar12 + 1;
            if (piVar3[uVar12 + 1] <= lVar11) {
              highsLogUser(local_5680,kInfo,"Col %d has status Dropped: Empty\n",uVar12 & 0xffffffff
                          );
              (local_56a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar12] = -1;
              run_status = Highs::changeColBounds(&highs,(HighsInt)uVar12,-INFINITY,INFINITY);
              pvVar9 = local_56a0;
              break;
            }
            piVar1 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar11;
            lVar11 = lVar11 + 1;
            pvVar9 = local_56a0;
          } while ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[*piVar1] == -1);
          goto LAB_0024bf43;
        }
      }
      std::__cxx11::string::~string((string *)&type);
      uVar14 = local_56a8 + 1;
    }
LAB_0024c001:
    piVar3 = (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar13 = 0;
    for (lVar11 = 0; __new_size = (size_type)iVar13, lVar11 < lp->num_col_; lVar11 = lVar11 + 1) {
      if (piVar4[lVar11] != -1) {
        piVar3[__new_size] = piVar3[lVar11];
        piVar4[__new_size] = piVar4[lVar11];
        iVar13 = iVar13 + 1;
      }
    }
    piVar3 = (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar13 = 0;
    for (lVar11 = 0; __new_size_00 = (size_type)iVar13, lVar11 < lp->num_row_; lVar11 = lVar11 + 1)
    {
      if (piVar4[lVar11] != -1) {
        piVar3[__new_size_00] = piVar3[lVar11];
        piVar4[__new_size_00] = piVar4[lVar11];
        iVar13 = iVar13 + 1;
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->col_index_,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(local_56a0,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(&this->row_index_,__new_size_00);
    std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size_00);
    this->valid_ = true;
    this->strategy_ = (local_5698->super_HighsOptionsStruct).iis_strategy;
    HVar7 = kOk;
  }
LAB_0024c0b2:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&primal_phase1_dual.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cost.super__Vector_base<double,_std::allocator<double>_>);
  Highs::~Highs(&highs);
  return HVar7;
}

Assistant:

HighsStatus HighsIis::compute(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis* basis) {
  const HighsLogOptions& log_options = options.log_options;
  const bool row_priority =
      //      options.iis_strategy == kIisStrategyFromRayRowPriority ||
      options.iis_strategy == kIisStrategyFromLpRowPriority;
  // Initially all columns and rows are candidates for the IIS
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) this->addCol(iCol);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) this->addRow(iRow);
  Highs highs;
  const HighsInfo& info = highs.getInfo();
  highs.setOptionValue("output_flag", kIisDevReport);
  highs.setOptionValue("presolve", kHighsOffString);
  const HighsLp& incumbent_lp = highs.getLp();
  const HighsBasis& incumbent_basis = highs.getBasis();
  const HighsSolution& solution = highs.getSolution();
  HighsStatus run_status = highs.passModel(lp);
  assert(run_status == HighsStatus::kOk);
  if (basis) highs.setBasis(*basis);

  // Zero the objective
  std::vector<double> cost;
  cost.assign(lp.num_col_, 0);
  run_status = highs.changeColsCost(0, lp.num_col_ - 1, cost.data());
  assert(run_status == HighsStatus::kOk);
  // Solve the LP
  if (basis) highs.setBasis(*basis);
  const bool use_sensitivity_filter = false;
  std::vector<double> primal_phase1_dual;
  bool row_deletion = false;
  HighsInt iX = -1;
  bool drop_lower = false;

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -highs.getRunTime();
    iis_info.simplex_iterations = -info.simplex_iteration_count;
    run_status = highs.run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    HighsModelStatus model_status = highs.getModelStatus();
    if (use_sensitivity_filter &&
        model_status == HighsModelStatus::kInfeasible) {
      printf("\nHighsIis::compute %s deletion for %d and %s bound\n",
             row_deletion ? "Row" : "Col", int(iX),
             drop_lower ? "Lower" : "Upper");
      bool output_flag;
      highs.getOptionValue("output_flag", output_flag);
      highs.setOptionValue("output_flag", true);
      HighsInt simplex_strategy;
      highs.getOptionValue("simplex_strategy", simplex_strategy);
      highs.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
      // Solve the LP
      run_status = highs.run();
      if (run_status != HighsStatus::kOk) return run_status;
      highs.writeSolution("", kSolutionStylePretty);
      const HighsInt* basic_index = highs.getBasicVariablesArray();
      std::vector<double> rhs;
      rhs.assign(lp.num_row_, 0);
      // Get duals for nonbasic rows, and initialise duals so that basic duals
      // are zero
      assert(101 == 202);

      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        HighsInt iVar = basic_index[iRow];
        const double lower = iVar < lp.num_col_
                                 ? lp.col_lower_[iVar]
                                 : lp.row_lower_[iVar - lp.num_col_];
        const double upper = iVar < lp.num_col_
                                 ? lp.col_upper_[iVar]
                                 : lp.row_upper_[iVar - lp.num_col_];
        const double value = iVar < lp.num_col_
                                 ? solution.col_value[iVar]
                                 : solution.row_value[iVar - lp.num_col_];
        if (value < lower - options.primal_feasibility_tolerance) {
          rhs[iRow] = -1;
        } else if (value > upper + options.primal_feasibility_tolerance) {
          rhs[iRow] = 1;
        }
      }
      HVector pi;
      pi.setup(lp.num_row_);
      highs.getBasisTransposeSolve(rhs.data(), &pi.array[0], NULL, NULL);
      pi.count = lp.num_row_;
      std::vector<double> reduced_costs_value;
      std::vector<HighsInt> reduced_costs_index;
      lp.a_matrix_.productTransposeQuad(reduced_costs_value,
                                        reduced_costs_index, pi);

      primal_phase1_dual = highs.getPrimalPhase1Dual();
      HighsInt num_zero_dual = 0;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        const HighsBasisStatus status = incumbent_basis.col_status[iCol];
        const double dual = primal_phase1_dual[iCol];
        const double lower = lp.col_lower_[iCol];
        const double upper = lp.col_upper_[iCol];
        const double value = solution.col_value[iCol];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Column %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iCol), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        const HighsBasisStatus status = incumbent_basis.row_status[iRow];
        const double dual = primal_phase1_dual[lp.num_col_ + iRow];
        const double lower = lp.row_lower_[iRow];
        const double upper = lp.row_upper_[iRow];
        const double value = solution.row_value[iRow];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Row    %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iRow), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      highs.setOptionValue("output_flag", output_flag);
      highs.setOptionValue("simplex_strategy", simplex_strategy);
      assert(!num_zero_dual);
    }
    iis_info.simplex_time += highs.getRunTime();
    iis_info.simplex_iterations += info.simplex_iteration_count;
    this->info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();
  if (run_status != HighsStatus::kOk) return run_status;

  assert(highs.getModelStatus() == HighsModelStatus::kInfeasible);

  // Pass twice: rows before columns, or columns before rows, according to
  // row_priority
  for (HighsInt k = 0; k < 2; k++) {
    row_deletion = (row_priority && k == 0) || (!row_priority && k == 1);
    std::string type = row_deletion ? "Row" : "Col";
    // Perform deletion pass
    HighsInt num_index = row_deletion ? lp.num_row_ : lp.num_col_;
    for (iX = 0; iX < num_index; iX++) {
      const HighsInt ix_status =
          row_deletion ? this->row_bound_[iX] : this->col_bound_[iX];
      if (ix_status == kIisBoundStatusDropped ||
          ix_status == kIisBoundStatusFree)
        continue;
      double lower = row_deletion ? lp.row_lower_[iX] : lp.col_lower_[iX];
      double upper = row_deletion ? lp.row_upper_[iX] : lp.col_upper_[iX];
      // Record whether the upper bound has been dropped due to the lower bound
      // being kept
      if (lower > -kHighsInf) {
        // Drop the lower bound temporarily
        bool drop_lower = true;
        run_status = row_deletion
                         ? highs.changeRowBounds(iX, -kHighsInf, upper)
                         : highs.changeColBounds(iX, -kHighsInf, upper);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the lower bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
          // If the lower bound must be kept, then any finite upper bound
          // must be dropped
          const bool apply_reciprocal_rule = true;
          if (apply_reciprocal_rule) {
            if (upper < kHighsInf) {
              // Drop the upper bound permanently
              upper = kHighsInf;
              run_status = row_deletion
                               ? highs.changeRowBounds(iX, lower, upper)
                               : highs.changeColBounds(iX, lower, upper);
              assert(run_status == HighsStatus::kOk);
            }
            assert(upper >= kHighsInf);
            // Since upper = kHighsInf, allow the loop to run so that
            // bound status is set as if upper were set to kHighsInf
            // by relaxing it and finding that the LP was still
            // infeasible
          }
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          lower = -kHighsInf;
        }
      }
      if (upper < kHighsInf) {
        // Drop the upper bound temporarily
        run_status = row_deletion ? highs.changeRowBounds(iX, lower, kHighsInf)
                                  : highs.changeColBounds(iX, lower, kHighsInf);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the upper bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          upper = kHighsInf;
        }
      }
      const bool debug_bound_change = true;
      if (debug_bound_change) {
        // Check bounds have been changed correctly
        double check_lower;
        double check_upper;
        double check_cost;
        HighsInt check_num_ix;
        HighsInt check_num_nz;
        run_status =
            row_deletion
                ? highs.getRows(iX, iX, check_num_ix, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr)
                : highs.getCols(iX, iX, check_num_ix, &check_cost, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr);
        assert(run_status == HighsStatus::kOk);
        assert(check_lower == lower);
        assert(check_upper == upper);
      }
      HighsInt iss_bound_status = kIisBoundStatusNull;
      if (lower <= -kHighsInf) {
        if (upper >= kHighsInf) {
          if (row_deletion) {
            // Free rows can be dropped
            iss_bound_status = kIisBoundStatusDropped;
          } else {
            // Free columns can only be dropped if they are empty
            iss_bound_status = kIisBoundStatusFree;
          }
        } else {
          iss_bound_status = kIisBoundStatusUpper;
        }
      } else {
        if (upper >= kHighsInf) {
          iss_bound_status = kIisBoundStatusLower;
        } else {
          // FX or BX: shouldn't happen
          iss_bound_status = kIisBoundStatusBoxed;
        }
      }
      assert(iss_bound_status != kIisBoundStatusNull);
      assert(iss_bound_status != kIisBoundStatusBoxed);
      if (row_deletion) {
        this->row_bound_[iX] = iss_bound_status;
      } else {
        this->col_bound_[iX] = iss_bound_status;
      }
      highsLogUser(log_options, HighsLogType::kInfo, "%s %d has status %s\n",
                   type.c_str(), int(iX),
                   iisBoundStatusToString(iss_bound_status).c_str());
    }
    if (k == 1) continue;
    // End of first pass: look to simplify second pass
    if (kIisDevReport) this->report("End of deletion", incumbent_lp);
    if (row_deletion) {
      // Mark empty columns as dropped
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        bool empty_col = true;
        for (HighsInt iEl = lp.a_matrix_.start_[iCol];
             iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
          if (this->row_bound_[lp.a_matrix_.index_[iEl]] !=
              kIisBoundStatusDropped) {
            empty_col = false;
            break;
          }
        }
        if (empty_col) {
          highsLogUser(log_options, HighsLogType::kInfo,
                       "Col %d has status Dropped: Empty\n", int(iCol));
          this->col_bound_[iCol] = kIisBoundStatusDropped;
          run_status = highs.changeColBounds(iCol, -kHighsInf, kHighsInf);
          assert(run_status == HighsStatus::kOk);
        }
      }
    }
    if (kIisDevReport) this->report("End of pass 1", incumbent_lp);
  }
  if (kIisDevReport) this->report("End of pass 2", incumbent_lp);
  HighsInt iss_num_col = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (this->col_bound_[iCol] != kIisBoundStatusDropped) {
      this->col_index_[iss_num_col] = this->col_index_[iCol];
      this->col_bound_[iss_num_col] = this->col_bound_[iCol];
      iss_num_col++;
    }
  }
  HighsInt iss_num_row = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (this->row_bound_[iRow] != kIisBoundStatusDropped) {
      this->row_index_[iss_num_row] = this->row_index_[iRow];
      this->row_bound_[iss_num_row] = this->row_bound_[iRow];
      iss_num_row++;
    }
  }
  this->col_index_.resize(iss_num_col);
  this->col_bound_.resize(iss_num_col);
  this->row_index_.resize(iss_num_row);
  this->row_bound_.resize(iss_num_row);
  this->valid_ = true;
  this->strategy_ = options.iis_strategy;
  return HighsStatus::kOk;
}